

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O3

void __thiscall FactorisedJoin::sortDataToProcess(FactorisedJoin *this)

{
  vector<int,std::allocator<int>> *this_00;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_01;
  long *plVar1;
  DTree *this_02;
  iterator __position;
  pointer piVar2;
  iterator __position_00;
  __normal_iterator<double_**,_std::vector<double_*,_std::allocator<double_*>_>_> __first;
  __normal_iterator<double_**,_std::vector<double_*,_std::allocator<double_*>_>_> __last;
  undefined1 auVar3 [16];
  pair<int,_int> pVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  size_type sVar9;
  DTreeNode *pDVar10;
  long lVar11;
  long lVar12;
  size_t i;
  ulong uVar13;
  undefined8 *puVar14;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__s;
  size_t sVar15;
  long *plVar16;
  _Iter_comp_iter<FactorisedJoin::ValueOrdering> __comp;
  _Iter_comp_iter<FactorisedJoin::ValueOrdering> __comp_00;
  vector<long,_std::allocator<long>_> priority;
  int index;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  treeAttributeIDs;
  pair<int,_int> local_a8;
  pair<int,_int> pStack_a0;
  pair<int,_int> local_98;
  long local_88;
  long local_80;
  ulong local_78;
  long local_70;
  string local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,dfdb::params::NUM_OF_TABLES,(allocator_type *)&local_a8);
  if (dfdb::params::NUM_OF_TABLES == 0) {
    sVar9 = 0;
  }
  else {
    uVar13 = 0;
    do {
      iVar5 = (*((this->_dataHandler).super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_DataHandler[5])();
      local_70 = uVar13 * 3;
      plVar1 = *(long **)(CONCAT44(extraout_var,iVar5) + 8 + uVar13 * 0x18);
      local_78 = uVar13;
      for (plVar16 = *(long **)(CONCAT44(extraout_var,iVar5) + uVar13 * 0x18); plVar16 != plVar1;
          plVar16 = plVar16 + 1) {
        lVar11 = *plVar16;
        iVar5 = (*((this->_dataHandler).super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_vptr_DataHandler[9])();
        for (puVar14 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar5) + 0x10);
            puVar14 != (undefined8 *)0x0; puVar14 = (undefined8 *)*puVar14) {
          local_a8 = (pair<int,_int>)&local_98;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,puVar14[1],puVar14[2] + puVar14[1]);
          local_88 = puVar14[5];
          if (local_88 == lVar11) {
            this_02 = (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_68,local_a8,(long)pStack_a0 + (long)local_a8);
            iVar5 = DTree::getIndexByName(this_02,&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            local_80 = CONCAT44(local_80._4_4_,iVar5);
            this_00 = (vector<int,std::allocator<int>> *)
                      (&((local_48.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + local_70);
            __position._M_current = *(int **)(this_00 + 8);
            if (__position._M_current == *(int **)(this_00 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_00,__position,(int *)&local_80);
            }
            else {
              *__position._M_current = iVar5;
              *(int **)(this_00 + 8) = __position._M_current + 1;
            }
            if (local_a8 != (pair<int,_int>)&local_98) {
              operator_delete((void *)local_a8);
            }
            break;
          }
          if (local_a8 != (pair<int,_int>)&local_98) {
            operator_delete((void *)local_a8);
          }
        }
      }
      uVar13 = local_78 + 1;
      sVar9 = dfdb::params::NUM_OF_TABLES;
    } while (uVar13 < dfdb::params::NUM_OF_TABLES);
  }
  uVar13 = CONCAT44(dfdb::params::NUM_OF_ATTRIBUTES._4_4_,(int)dfdb::params::NUM_OF_ATTRIBUTES);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar13;
  uVar6 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar7 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar7 = 0xffffffffffffffff;
  }
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
    uVar6 = uVar7;
  }
  puVar8 = (ulong *)operator_new__(uVar6);
  *puVar8 = uVar13;
  __s = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(puVar8 + 1);
  uVar6 = sVar9;
  if (uVar13 == 0) {
    this->_ids = __s;
  }
  else {
    uVar7 = 0;
    memset(__s,0,((uVar13 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
    this->_ids = __s;
    do {
      if (sVar9 == 0) {
        sVar9 = 0;
      }
      else {
        uVar13 = 0;
        sVar9 = uVar6;
        do {
          piVar2 = local_48.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          lVar11 = (long)local_48.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar13].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar2;
          if (lVar11 != 0) {
            lVar11 = lVar11 >> 2;
            lVar12 = 0;
            do {
              if (piVar2[lVar12] == (int)uVar7) {
                this_01 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                          (this->_ids + uVar7);
                local_a8.second = (int)lVar12;
                local_a8.first = (int)uVar13;
                __position_00._M_current = *(pair<int,_int> **)(this_01 + 8);
                if (__position_00._M_current == *(pair<int,_int> **)(this_01 + 0x10)) {
                  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                  _M_realloc_insert<std::pair<int,int>>(this_01,__position_00,&local_a8);
                  sVar9 = dfdb::params::NUM_OF_TABLES;
                }
                else {
                  *__position_00._M_current = local_a8;
                  *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
                  sVar9 = dfdb::params::NUM_OF_TABLES;
                }
                break;
              }
              lVar12 = lVar12 + 1;
            } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < sVar9);
        uVar13 = CONCAT44(dfdb::params::NUM_OF_ATTRIBUTES._4_4_,(int)dfdb::params::NUM_OF_ATTRIBUTES
                         );
        uVar6 = sVar9;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar13);
  }
  local_a8.first = 0;
  local_a8.second = 0;
  pStack_a0.first = 0;
  pStack_a0.second = 0;
  local_98.first = 0;
  local_98.second = 0;
  if (uVar6 != 0) {
    uVar13 = 0;
    do {
      if (pStack_a0 != local_a8) {
        pStack_a0 = local_a8;
      }
      pDVar10 = DTree::getNode((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(int)dfdb::params::NUM_OF_ATTRIBUTES + (int)uVar13);
      pVar4 = local_a8;
      lVar11 = local_80;
      for (pDVar10 = pDVar10->_parent; local_a8 = pVar4, pDVar10 != (DTreeNode *)0x0;
          pDVar10 = pDVar10->_parent) {
        piVar2 = local_48.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        lVar12 = (long)local_48.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish - (long)piVar2;
        if (lVar12 != 0) {
          lVar12 = lVar12 >> 2;
          local_80 = 0;
          do {
            if (pDVar10->_id == piVar2[local_80]) {
              if (pStack_a0 == local_98) {
                std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          ((vector<long,std::allocator<long>> *)&local_a8,(iterator)pStack_a0,
                           &local_80);
                lVar11 = local_80;
              }
              else {
                *(long *)pStack_a0 = local_80;
                pStack_a0 = (pair<int,_int>)((long)pStack_a0 + 8);
                lVar11 = local_80;
              }
              break;
            }
            local_80 = local_80 + 1;
          } while (lVar12 + (ulong)(lVar12 == 0) != local_80);
        }
        local_80 = lVar11;
        pVar4 = local_a8;
        lVar11 = local_80;
      }
      __first._M_current =
           this->_data[uVar13].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      __last._M_current =
           this->_data[uVar13].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_80 = lVar11;
      if (__first._M_current != __last._M_current) {
        sVar15 = ((long)pStack_a0 - (long)pVar4 >> 3) - 1;
        uVar6 = (long)__last._M_current - (long)__first._M_current >> 3;
        lVar11 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        __comp._M_comp.priorityMaxIndex = sVar15;
        __comp._M_comp.priority = (int_fast16_t *)pVar4;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<double**,std::vector<double*,std::allocator<double*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<FactorisedJoin::ValueOrdering>>
                  (__first,__last,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,__comp);
        __comp_00._M_comp.priorityMaxIndex = sVar15;
        __comp_00._M_comp.priority = (int_fast16_t *)pVar4;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<double**,std::vector<double*,std::allocator<double*>>>,__gnu_cxx::__ops::_Iter_comp_iter<FactorisedJoin::ValueOrdering>>
                  (__first,__last,__comp_00);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < dfdb::params::NUM_OF_TABLES);
    if (local_a8 != (pair<int,_int>)0x0) {
      operator_delete((void *)local_a8);
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void FactorisedJoin::sortDataToProcess()
{
    /* Contains an ID for each node in the DTree and for each table. */
    vector<vector<int> > treeAttributeIDs(NUM_OF_TABLES);

    /* Iterate through all tables. */
    for (size_t table = 0; table < NUM_OF_TABLES; ++table)
    {
        /* Iterate through all the table attribute IDs of the current table. */
        for (uint_fast16_t id : _dataHandler->getTableAttributes()[table])
        {
            /* Scan through the (string, ID) mapping to find the attribute name of the current attribute ID. */
            for (auto pair : _dataHandler->getNamesMapping())
            {
                if (pair.second == id)
                {
                    /* Retrieve DTree ID with attribute name. */
                    auto index = _dTree->getIndexByName(pair.first);

                    treeAttributeIDs[table].push_back(
                        index);
                    break;
                }
            }
        }
    }

    /*
     * The ids vectors will contain the pairs of INDEXES in the array attributes-attr.
     * For each attribute KEY-index we append the pairs of indexes having that key,
     * so we will have all the pairs of <relationIndex-attributeIndex> for each attribute KEY.
     */
    _ids = new vector<pair<int, int> > [NUM_OF_ATTRIBUTES];
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {
        for (size_t j = 0; j < NUM_OF_TABLES; ++j)
        {
            for (size_t k = 0; k < treeAttributeIDs[j].size(); ++k)
                if (treeAttributeIDs[j][k] == (int) i)
                {
                    _ids[i].push_back(make_pair(j, k));
                    break;
                }
        }
    }

    vector<int_fast16_t> priority;
    for (size_t table = 0; table < NUM_OF_TABLES; ++table)
    {
        priority.clear();

        DTreeNode* node = _dTree->getNode(table + NUM_OF_ATTRIBUTES)->_parent;

        while (node != NULL)
        {
            int_fast16_t pos = -1;
            for (size_t j = 0; j < treeAttributeIDs[table].size(); ++j)
                if (node->_id == treeAttributeIDs[table][j])
                {
                    pos = j;
                    break;
                }
            if (pos != -1)
                priority.push_back(pos);
            node = node->_parent;
        }

        /* Launch sorting; depending on the compiler, this will or will not be done in parallel. */
        sortingAlgorithm(_data[table].begin(), _data[table].end(),
                         ValueOrdering(priority.data(), priority.size()));
    }

    DINFO("WORKER - engine: finished sorting data to process.\n");
}